

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O2

void __thiscall
oout::SuiteTest::
SuiteTest<ContainMatchTest,ContainTestTest,CountErrorTest,CountFailureTest,CountTestTest,CtorExceptionTextTest,DirtyTestTest,EndsWithMatchTest,EndsWithTestTest,FunctionTextTest,GtestReportTextTest,MatchTestTest,MethodExceptionTextTest,NamedTestTest,OoutReportTextTest,PrintableTextTest,RegexMatchTest,RegexTestTest,SafeTestTest,SkippedTestTest,StartsWithMatchTest,StartsWithTestTest,SuiteTestTest,XmlReportTextTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<ContainMatchTest> *tests,
          shared_ptr<ContainTestTest> *tests_1,shared_ptr<CountErrorTest> *tests_2,
          shared_ptr<CountFailureTest> *tests_3,shared_ptr<CountTestTest> *tests_4,
          shared_ptr<CtorExceptionTextTest> *tests_5,shared_ptr<DirtyTestTest> *tests_6,
          shared_ptr<EndsWithMatchTest> *tests_7,shared_ptr<EndsWithTestTest> *tests_8,
          shared_ptr<FunctionTextTest> *tests_9,shared_ptr<GtestReportTextTest> *tests_10,
          shared_ptr<MatchTestTest> *tests_11,shared_ptr<MethodExceptionTextTest> *tests_12,
          shared_ptr<NamedTestTest> *tests_13,shared_ptr<OoutReportTextTest> *tests_14,
          shared_ptr<PrintableTextTest> *tests_15,shared_ptr<RegexMatchTest> *tests_16,
          shared_ptr<RegexTestTest> *tests_17,shared_ptr<SafeTestTest> *tests_18,
          shared_ptr<SkippedTestTest> *tests_19,shared_ptr<StartsWithMatchTest> *tests_20,
          shared_ptr<StartsWithTestTest> *tests_21,shared_ptr<SuiteTestTest> *tests_22,
          shared_ptr<XmlReportTextTest> *tests_23)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  allocator_type local_1e1;
  SuiteTest *local_1e0;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_1d8;
  __shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_1b0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_1a0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_190 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_180 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_170 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_160 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_150 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_140 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_130 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_120 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_110 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_100 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_f0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_e0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_d0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_c0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_b0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_a0 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_90 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_80 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_70 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_60 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_50 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_40 [16];
  
  local_1e0 = this;
  std::__shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1c0,&test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ContainMatchTest,void>
            (local_1b0,&tests->super___shared_ptr<ContainMatchTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ContainTestTest,void>
            (local_1a0,&tests_1->super___shared_ptr<ContainTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CountErrorTest,void>
            (local_190,&tests_2->super___shared_ptr<CountErrorTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<CountFailureTest,void>
            (local_180,&tests_3->super___shared_ptr<CountFailureTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CountTestTest,void>
            (local_170,&tests_4->super___shared_ptr<CountTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<CtorExceptionTextTest,void>
            (local_160,
             &tests_5->super___shared_ptr<CtorExceptionTextTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<DirtyTestTest,void>
            (local_150,&tests_6->super___shared_ptr<DirtyTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<EndsWithMatchTest,void>
            (local_140,&tests_7->super___shared_ptr<EndsWithMatchTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<EndsWithTestTest,void>
            (local_130,&tests_8->super___shared_ptr<EndsWithTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<FunctionTextTest,void>
            (local_120,&tests_9->super___shared_ptr<FunctionTextTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<GtestReportTextTest,void>
            (local_110,
             &tests_10->super___shared_ptr<GtestReportTextTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<MatchTestTest,void>
            (local_100,&tests_11->super___shared_ptr<MatchTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<MethodExceptionTextTest,void>
            (local_f0,&tests_12->
                       super___shared_ptr<MethodExceptionTextTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NamedTestTest,void>
            (local_e0,&tests_13->super___shared_ptr<NamedTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<OoutReportTextTest,void>
            (local_d0,&tests_14->super___shared_ptr<OoutReportTextTest,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<PrintableTextTest,void>
            (local_c0,&tests_15->super___shared_ptr<PrintableTextTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<RegexMatchTest,void>
            (local_b0,&tests_16->super___shared_ptr<RegexMatchTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<RegexTestTest,void>
            (local_a0,&tests_17->super___shared_ptr<RegexTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SafeTestTest,void>
            (local_90,&tests_18->super___shared_ptr<SafeTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SkippedTestTest,void>
            (local_80,&tests_19->super___shared_ptr<SkippedTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<StartsWithMatchTest,void>
            (local_70,&tests_20->super___shared_ptr<StartsWithMatchTest,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<StartsWithTestTest,void>
            (local_60,&tests_21->super___shared_ptr<StartsWithTestTest,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SuiteTestTest,void>
            (local_50,&tests_22->super___shared_ptr<SuiteTestTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<XmlReportTextTest,void>
            (local_40,&tests_23->super___shared_ptr<XmlReportTextTest,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 0x19;
  __l._M_array = (iterator)&local_1c0;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)&local_1d8,__l,&local_1e1);
  SuiteTest(local_1e0,
            (list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
             *)&local_1d8);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_1d8);
  lVar1 = 0x188;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_1c0._M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}